

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O2

void conn_port_to_str(uint16_t port,char *result)

{
  bool bVar1;
  uint uVar2;
  uint16_t uVar3;
  uint16_t port_tmp;
  char cVar4;
  
  cVar4 = -1;
  uVar3 = port;
  do {
    cVar4 = cVar4 + '\x01';
    bVar1 = 9 < uVar3;
    uVar3 = uVar3 / 10;
  } while (bVar1);
  switch(cVar4) {
  case '\x04':
    uVar2 = (uint)port;
    port = port % 10000;
    *result = (byte)(uVar2 / 10000) | 0x30;
    result = result + 1;
  case '\x03':
    uVar2 = (uint)port;
    port = port % 1000;
    *result = (char)(uVar2 / 1000) + '0';
    result = result + 1;
  case '\x02':
    uVar2 = (uint)port;
    port = port % 100;
    *result = (char)(uVar2 / 100) + '0';
    result = result + 1;
  case '\x01':
    uVar2 = (uint)port;
    port = port % 10;
    *result = (char)(uVar2 / 10) + '0';
    result = result + 1;
  case '\0':
    *result = (char)port + '0';
    result = result + 1;
  default:
    *result = '\0';
    return;
  }
}

Assistant:

void conn_port_to_str(uint16_t port, char result[6])
{
	uint16_t port_tmp = port;
	uint8_t n = 0;

	do {
		n++;
		port_tmp /= 10;
	} while (port_tmp != 0);

	port_tmp = port;

	switch (n) {
	case 5:
		*result = (char)(48 + port_tmp / 10000);
		port_tmp %= 10000;
		result++;
		/* fall through */
	case 4:
		*result = (char)(48 + port_tmp / 1000);
		port_tmp %= 1000;
		result++;
		/* fall through */
	case 3:
		*result = (char)(48 + port_tmp / 100);
		port_tmp %= 100;
		result++;
		/* fall through */
	case 2:
		*result = (char)(48 + port_tmp / 10);
		port_tmp %= 10;
		result++;
		/* fall through */
	case 1:
		*result = (char)(48 + port_tmp);
		result++;
	}

	*result = '\0';
}